

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::Integer::IsSameImpl(Integer *this,Type *that,IsSameCache *param_2)

{
  int iVar1;
  undefined4 extraout_var;
  bool local_29;
  Integer *it;
  IsSameCache *param_2_local;
  Type *that_local;
  Integer *this_local;
  long lVar2;
  
  iVar1 = (*that->_vptr_Type[10])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_29 = false;
  if (((lVar2 != 0) &&
      (local_29 = false, *(int *)&(this->super_Type).field_0x24 == *(int *)(lVar2 + 0x24))) &&
     (local_29 = false, (this->signed_ & 1U) == (*(byte *)(lVar2 + 0x28) & 1))) {
    local_29 = analysis::Type::HasSameDecorations(&this->super_Type,that);
  }
  return local_29;
}

Assistant:

bool Integer::IsSameImpl(const Type* that, IsSameCache*) const {
  const Integer* it = that->AsInteger();
  return it && width_ == it->width_ && signed_ == it->signed_ &&
         HasSameDecorations(that);
}